

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

size_t xdirname(char *dp,char *path,size_t dplen)

{
  char *pcVar1;
  size_t sVar2;
  char local_428 [8];
  char ts [1024];
  
  strlcpy(local_428,path,0x400);
  pcVar1 = dirname(local_428);
  sVar2 = strlcpy(dp,pcVar1,dplen);
  if (((dplen != 0) && (*dp == '/')) && (dp[1] == '\0')) {
    *dp = '\0';
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t
xdirname(char *dp, const char *path, size_t dplen)
{
	char ts[NFILEN];
	size_t len;

	(void)strlcpy(ts, path, NFILEN);
	len = strlcpy(dp, dirname(ts), dplen);
	if (dplen > 0 && dp[0] == '/' && dp[1] == '\0') {
		dp[0] = '\0';
		len = 0;
	}
	return (len);
}